

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
JsonObject_ArrayValue_Test::JsonObject_ArrayValue_Test(JsonObject_ArrayValue_Test *this)

{
  anon_unknown.dwarf_151a55::JsonObject::JsonObject(&this->super_JsonObject);
  (this->super_JsonObject).super_Test._vptr_Test = (_func_int **)&PTR__JsonObject_001ac6a8;
  return;
}

Assistant:

TEST_F (JsonObject, ArrayValue) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (2)).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }

    auto p = json::make_parser (proxy_);
    p.input (std::string{"{\"a\": [1,2]}"});
    p.eof ();
    EXPECT_FALSE (p.has_error ());
}